

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

ostream * IO::operator<<(ostream *output,Reaction *reaction)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  double *pdVar4;
  
  poVar1 = std::operator<<(output,"    Reaction Data\n");
  poVar1 = std::operator<<(poVar1,"    (\n");
  poVar1 = std::operator<<(poVar1,"        Reversible  : ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"        P Dependent : ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"        Duplicate : ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"        Reactants\n");
  std::operator<<(poVar1,"        (\n");
  for (p_Var2 = (reaction->reactants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(reaction->reactants_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(output,"            Name : ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::operator<<(poVar1," | Stoich : ");
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::operator<<(poVar1,"\n");
  }
  poVar1 = std::operator<<(output,"        )\n");
  poVar1 = std::operator<<(poVar1,"        Products\n");
  std::operator<<(poVar1,"        (\n");
  for (p_Var3 = (reaction->products_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(reaction->products_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar1 = std::operator<<(output,"            Name : ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
    poVar1 = std::operator<<(poVar1,(string *)(p_Var3 + 1));
    std::operator<<(poVar1," | Stoich : ");
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var3 + 2));
    std::operator<<(poVar1,"\n");
  }
  poVar1 = std::operator<<(output,"        )\n");
  poVar1 = std::operator<<(poVar1,"        Arrhenius\n");
  poVar1 = std::operator<<(poVar1,"        (\n");
  std::operator<<(poVar1,"            Forward A = ");
  poVar1 = std::ostream::_M_insert<double>((reaction->forwardArrhenius_).A);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"                    n = ");
  poVar1 = std::ostream::_M_insert<double>((reaction->forwardArrhenius_).n);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"                    E = ");
  poVar1 = std::ostream::_M_insert<double>((reaction->forwardArrhenius_).E);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"            Reverse A = ");
  poVar1 = std::ostream::_M_insert<double>((reaction->reverseArrhenius_).A);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"                    n = ");
  poVar1 = std::ostream::_M_insert<double>((reaction->reverseArrhenius_).n);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"                    E = ");
  poVar1 = std::ostream::_M_insert<double>((reaction->reverseArrhenius_).E);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"        )\n");
  poVar1 = std::operator<<(poVar1,"        Third Bodies\n");
  poVar1 = std::operator<<(poVar1,"        (\n");
  poVar1 = std::operator<<(poVar1,"            Third Body : ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  for (p_Var2 = (reaction->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(reaction->thirdBodies_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(output,"            Name : ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::operator<<(poVar1," | Efficiency Factor : ");
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::operator<<(poVar1,"\n");
  }
  for (pdVar4 = (reaction->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != (reaction->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    std::operator<<(output,"            LOW : ");
    poVar1 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar1,"\n");
  }
  for (pdVar4 = (reaction->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != (reaction->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    std::operator<<(output,"            TROE : ");
    poVar1 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar1,"\n");
  }
  for (pdVar4 = (reaction->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != (reaction->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    std::operator<<(output,"            SRI : ");
    poVar1 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar1,"\n");
  }
  poVar1 = std::operator<<(output,"        )\n");
  std::operator<<(poVar1,"    )");
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Reaction& reaction)
    {
        multimap<string,double>::const_iterator iter;
        vector<double>::const_iterator iterVec;

        output << "    Reaction Data\n"
               << "    (\n"
               << "        Reversible  : " << reaction.flagReversible_ << "\n"
               << "        P Dependent : " << reaction.flagPressureDependent_ << "\n"
               << "        Duplicate : " << reaction.flagDuplicate_ << "\n"
               << "        Reactants\n"
               << "        (\n";
       for (iter = reaction.reactants_.begin(); iter != reaction.reactants_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Stoich : " << iter->second << "\n";
       }
        output << "        )\n"
               << "        Products\n"
               << "        (\n";
       for (iter = reaction.products_.begin(); iter != reaction.products_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Stoich : " << iter->second << "\n";
       }
        output << "        )\n"
               << "        Arrhenius\n"
               << "        (\n"
               << "            Forward A = " << reaction.forwardArrhenius_.A << "\n"
               << "                    n = " << reaction.forwardArrhenius_.n << "\n"
               << "                    E = " << reaction.forwardArrhenius_.E << "\n"
               << "            Reverse A = " << reaction.reverseArrhenius_.A << "\n"
               << "                    n = " << reaction.reverseArrhenius_.n << "\n"
               << "                    E = " << reaction.reverseArrhenius_.E << "\n"
               << "        )\n"
               << "        Third Bodies\n"
               << "        (\n"
               << "            Third Body : " << reaction.flagThirdBody_ << "\n";
       for (iter = reaction.thirdBodies_.begin(); iter != reaction.thirdBodies_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Efficiency Factor : " << iter->second << "\n";
       }
       for (iterVec = reaction.LOW_.begin(); iterVec != reaction.LOW_.end(); ++iterVec)
       {
        output << "            LOW : " << *iterVec << "\n";
       }
       for (iterVec = reaction.TROE_.begin(); iterVec != reaction.TROE_.end(); ++iterVec)
       {
        output << "            TROE : " << *iterVec << "\n";
       }
       for (iterVec = reaction.SRI_.begin(); iterVec != reaction.SRI_.end(); ++iterVec)
       {
        output << "            SRI : " << *iterVec << "\n";
       }
        output << "        )\n"
               << "    )";
        return output;
    }